

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> __thiscall
wabt::MakeUnique<wabt::FuncTypeModuleField,wabt::Location_const&>(wabt *this,Location *args)

{
  Location *loc;
  FuncTypeModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (FuncTypeModuleField *)operator_new(0x90);
  loc = local_18;
  string_view::string_view(&local_28);
  FuncTypeModuleField::FuncTypeModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::FuncTypeModuleField,std::default_delete<wabt::FuncTypeModuleField>>::
  unique_ptr<std::default_delete<wabt::FuncTypeModuleField>,void>
            ((unique_ptr<wabt::FuncTypeModuleField,std::default_delete<wabt::FuncTypeModuleField>> *
             )this,this_00);
  return (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}